

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

DSA_SIG * d2i_DSA_SIG(DSA_SIG **v,uchar **pp,long length)

{
  uint8_t *puVar1;
  DSA_SIG *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  DSA_SIG **out_sig_local;
  
  if (length < 0) {
    out_sig_local = (DSA_SIG **)0x0;
  }
  else {
    cbs.len = length;
    CBS_init((CBS *)&ret,*pp,length);
    out_sig_local = (DSA_SIG **)DSA_SIG_parse((CBS *)&ret);
    if ((DSA_SIG *)out_sig_local == (DSA_SIG *)0x0) {
      out_sig_local = (DSA_SIG **)0x0;
    }
    else {
      if (v != (DSA_SIG **)0x0) {
        DSA_SIG_free(*v);
        *v = (DSA_SIG *)out_sig_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *pp = puVar1;
    }
  }
  return (DSA_SIG *)out_sig_local;
}

Assistant:

DSA_SIG *d2i_DSA_SIG(DSA_SIG **out_sig, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  DSA_SIG *ret = DSA_SIG_parse(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out_sig != NULL) {
    DSA_SIG_free(*out_sig);
    *out_sig = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}